

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::ClockingDeclarationSyntax::ClockingDeclarationSyntax
          (ClockingDeclarationSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,Token globalOrDefault,
          Token clocking,Token blockName,Token at,EventExpressionSyntax *event,Token semi,
          SyntaxList<slang::syntax::MemberSyntax> *items,Token endClocking,
          NamedBlockClauseSyntax *endBlockName)

{
  Token TVar1;
  Token TVar2;
  Token TVar3;
  Token TVar4;
  EventExpressionSyntax *pEVar5;
  iterator ppMVar6;
  MemberSyntax *child;
  iterator __end2;
  iterator __begin2;
  SyntaxList<slang::syntax::MemberSyntax> *__range2;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *local_38;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes_local;
  ClockingDeclarationSyntax *this_local;
  Token clocking_local;
  Token globalOrDefault_local;
  
  TVar4 = endClocking;
  TVar3 = semi;
  TVar2 = at;
  TVar1 = blockName;
  clocking_local._0_8_ = clocking.info;
  this_local = clocking._0_8_;
  clocking_local.info = globalOrDefault._0_8_;
  local_38 = attributes;
  attributes_local = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)this;
  MemberSyntax::MemberSyntax(&this->super_MemberSyntax,ClockingDeclaration,attributes);
  *(Info **)&this->globalOrDefault = clocking_local.info;
  (this->globalOrDefault).info = globalOrDefault.info;
  *(ClockingDeclarationSyntax **)&this->clocking = this_local;
  (this->clocking).info = (Info *)clocking_local._0_8_;
  (this->blockName).kind = blockName.kind;
  (this->blockName).field_0x2 = blockName._2_1_;
  (this->blockName).numFlags = (NumericTokenFlags)blockName.numFlags.raw;
  (this->blockName).rawLen = blockName.rawLen;
  blockName.info = TVar1.info;
  (this->blockName).info = blockName.info;
  (this->at).kind = at.kind;
  (this->at).field_0x2 = at._2_1_;
  (this->at).numFlags = (NumericTokenFlags)at.numFlags.raw;
  (this->at).rawLen = at.rawLen;
  at.info = TVar2.info;
  (this->at).info = at.info;
  __range2 = (SyntaxList<slang::syntax::MemberSyntax> *)event;
  not_null<slang::syntax::EventExpressionSyntax*>::
  not_null<slang::syntax::EventExpressionSyntax*,void>
            ((not_null<slang::syntax::EventExpressionSyntax*> *)&this->event,
             (EventExpressionSyntax **)&__range2);
  (this->semi).kind = semi.kind;
  (this->semi).field_0x2 = semi._2_1_;
  (this->semi).numFlags = (NumericTokenFlags)semi.numFlags.raw;
  (this->semi).rawLen = semi.rawLen;
  semi.info = TVar3.info;
  (this->semi).info = semi.info;
  SyntaxList<slang::syntax::MemberSyntax>::SyntaxList(&this->items,items);
  (this->endClocking).kind = endClocking.kind;
  (this->endClocking).field_0x2 = endClocking._2_1_;
  (this->endClocking).numFlags = (NumericTokenFlags)endClocking.numFlags.raw;
  (this->endClocking).rawLen = endClocking.rawLen;
  endClocking.info = TVar4.info;
  (this->endClocking).info = endClocking.info;
  this->endBlockName = endBlockName;
  pEVar5 = not_null<slang::syntax::EventExpressionSyntax_*>::operator->(&this->event);
  (pEVar5->super_SequenceExprSyntax).super_SyntaxNode.parent = (SyntaxNode *)this;
  (this->items).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  __end2 = nonstd::span_lite::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>::begin
                     (&(this->items).
                       super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>);
  ppMVar6 = nonstd::span_lite::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>::end
                      (&(this->items).
                        super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>);
  for (; __end2 != ppMVar6; __end2 = __end2 + 1) {
    ((*__end2)->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  if (this->endBlockName != (NamedBlockClauseSyntax *)0x0) {
    (this->endBlockName->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  return;
}

Assistant:

ClockingDeclarationSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token globalOrDefault, Token clocking, Token blockName, Token at, EventExpressionSyntax& event, Token semi, const SyntaxList<MemberSyntax>& items, Token endClocking, NamedBlockClauseSyntax* endBlockName) :
        MemberSyntax(SyntaxKind::ClockingDeclaration, attributes), globalOrDefault(globalOrDefault), clocking(clocking), blockName(blockName), at(at), event(&event), semi(semi), items(items), endClocking(endClocking), endBlockName(endBlockName) {
        this->event->parent = this;
        this->items.parent = this;
        for (auto child : this->items)
            child->parent = this;
        if (this->endBlockName) this->endBlockName->parent = this;
    }